

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O3

void toml::detail::skip_until_next_table<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  size_t *psVar1;
  pointer puVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  element_type *peVar7;
  size_t sVar8;
  location line_begin;
  sequence local_100;
  location local_e0;
  region local_98;
  
  peVar7 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar5 = loc->location_;
  lVar3 = (long)(peVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar6 = (long)(peVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar3;
  if (uVar5 < uVar6) {
    psVar1 = &loc->location_;
    do {
      if (*(char *)(lVar3 + uVar5) == '\n') {
        if (uVar5 + 1 < uVar6) {
          loc->line_number_ = loc->line_number_ + 1;
          loc->column_number_ = 1;
          uVar6 = uVar5 + 1;
        }
        else {
          sVar4 = loc->line_number_;
          sVar8 = loc->column_number_;
          do {
            if (*(char *)(lVar3 + uVar5) == '\n') {
              sVar4 = sVar4 + 1;
              loc->line_number_ = sVar4;
              sVar8 = 1;
            }
            else {
              sVar8 = sVar8 + 1;
            }
            loc->column_number_ = sVar8;
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
        }
        loc->location_ = uVar6;
        location::location(&local_e0,loc);
        skip_whitespace<toml::type_config>(loc,ctx);
        syntax::std_table(&local_100,&ctx->toml_spec_);
        sequence::scan(&local_98,&local_100,loc);
        peVar7 = local_98.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        region::~region(&local_98);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector(&local_100.others_);
        if (peVar7 != (element_type *)0x0) {
LAB_003a7838:
          (loc->source_).
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_e0.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &(loc->source_).
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_e0.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &loc->source_name_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &local_e0.source_name_);
          loc->column_number_ = local_e0.column_number_;
          *psVar1 = local_e0.location_;
          loc->line_number_ = local_e0.line_number_;
          location::~location(&local_e0);
          return;
        }
        syntax::array_table(&local_100,&ctx->toml_spec_);
        sequence::scan(&local_98,&local_100,loc);
        peVar7 = local_98.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        region::~region(&local_98);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector(&local_100.others_);
        if (peVar7 != (element_type *)0x0) goto LAB_003a7838;
        location::~location(&local_e0);
        peVar7 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar5 = loc->location_;
        lVar3 = (long)(peVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
      }
      puVar2 = (peVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar6 = (long)puVar2 - lVar3;
      if (uVar5 + 1 < uVar6) {
        if (*(char *)(lVar3 + uVar5) == '\n') {
          loc->line_number_ = loc->line_number_ + 1;
          sVar4 = 1;
        }
        else {
          sVar4 = loc->column_number_ + 1;
        }
        loc->column_number_ = sVar4;
        uVar5 = uVar5 + 1;
      }
      else if (uVar6 != uVar5) {
        sVar4 = loc->line_number_;
        sVar8 = loc->column_number_;
        do {
          if (*(char *)(lVar3 + uVar5) == '\n') {
            sVar4 = sVar4 + 1;
            loc->line_number_ = sVar4;
            sVar8 = 1;
          }
          else {
            sVar8 = sVar8 + 1;
          }
          loc->column_number_ = sVar8;
          uVar5 = uVar5 + 1;
        } while ((long)puVar2 - lVar3 != uVar5);
        *psVar1 = uVar6;
        return;
      }
      *psVar1 = uVar5;
    } while (uVar5 < uVar6);
  }
  return;
}

Assistant:

void skip_until_next_table(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    while( ! loc.eof())
    {
        if(loc.current() == '\n')
        {
            loc.advance();
            const auto line_begin = loc;

            skip_whitespace(loc, ctx);
            if(syntax::std_table(spec).scan(loc).is_ok())
            {
                loc = line_begin;
                return ;
            }
            if(syntax::array_table(spec).scan(loc).is_ok())
            {
                loc = line_begin;
                return ;
            }
        }
        loc.advance();
    }
}